

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3UpsertAnalyzeTarget(Parse *pParse,SrcList *pTabList,Upsert *pUpsert)

{
  Table *pTVar1;
  ExprList *pEVar2;
  Expr *pEVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  Index *pIVar10;
  ExprList *pEVar11;
  Expr *pEVar12;
  ulong uVar13;
  char zWhich [16];
  NameContext sNC;
  Expr sCol [2];
  char local_118 [16];
  NameContext local_108;
  Expr local_c8;
  Expr local_80;
  
  local_108.uNC.pEList = (ExprList *)0x0;
  local_108.pNext = (NameContext *)0x0;
  local_108.nRef = 0;
  local_108.nNcErr = 0;
  local_108.ncFlags = 0;
  local_108._44_4_ = 0;
  local_108.pWinSelect = (Select *)0x0;
  if (pUpsert != (Upsert *)0x0) {
    iVar9 = 0;
    local_108.pParse = pParse;
    local_108.pSrcList = pTabList;
    do {
      if (pUpsert->pUpsertTarget == (ExprList *)0x0) {
        return 0;
      }
      iVar4 = sqlite3ResolveExprListNames(&local_108,pUpsert->pUpsertTarget);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = sqlite3ResolveExprNames(&local_108,pUpsert->pUpsertTargetWhere);
      if (iVar4 != 0) {
        return 1;
      }
      pTVar1 = pTabList->a[0].pTab;
      pEVar2 = pUpsert->pUpsertTarget;
      iVar4 = pTabList->a[0].iCursor;
      if (((((pTVar1->tabFlags & 0x80) != 0) || (pEVar2->nExpr != 1)) ||
          (pEVar12 = pEVar2->a[0].pExpr, pEVar12->op != 0xa7)) || (pEVar12->iColumn != -1)) {
        memset(&local_c8,0,0x90);
        local_c8.op = 'q';
        local_c8.pLeft = &local_80;
        local_80.op = 0xa7;
        pIVar10 = pTVar1->pIndex;
        local_80.iTable = iVar4;
        if (pIVar10 != (Index *)0x0) {
          do {
            if (((pIVar10->onError != '\0') && (pEVar2->nExpr == (uint)pIVar10->nKeyCol)) &&
               ((pIVar10->pPartIdxWhere == (Expr *)0x0 ||
                ((pUpsert->pUpsertTargetWhere != (Expr *)0x0 &&
                 (iVar5 = sqlite3ExprCompare(pParse,pUpsert->pUpsertTargetWhere,
                                             pIVar10->pPartIdxWhere,iVar4), iVar5 == 0)))))) {
              uVar7 = (ulong)pIVar10->nKeyCol;
              if (uVar7 != 0) {
                uVar13 = 0;
                do {
                  local_c8.u = *(anon_union_8_2_443a03b8_for_u *)(pIVar10->azColl + uVar13);
                  if (pIVar10->aiColumn[uVar13] == -2) {
                    pEVar3 = pIVar10->aColExpr->a[uVar13].pExpr;
                    pEVar12 = pEVar3;
                    if (pEVar3->op != 'q') {
                      pEVar12 = &local_c8;
                      local_c8.pLeft = pEVar3;
                    }
                  }
                  else {
                    local_c8.pLeft = &local_80;
                    pEVar12 = &local_c8;
                    local_80.iColumn = pIVar10->aiColumn[uVar13];
                  }
                  uVar6 = sqlite3ExprCompare(pParse,pEVar2->a[0].pExpr,pEVar12,iVar4);
                  if (1 < uVar6) {
                    uVar8 = 0;
                    pEVar11 = pEVar2 + 1;
                    do {
                      if (uVar7 - 1 == uVar8) goto LAB_001b31c2;
                      uVar6 = sqlite3ExprCompare(pParse,*(Expr **)pEVar11,pEVar12,iVar4);
                      pEVar11 = (ExprList *)&pEVar11->a[0].fg;
                      uVar8 = uVar8 + 1;
                    } while (1 < uVar6);
                    if (uVar7 <= uVar8) goto LAB_001b31c2;
                  }
                  uVar13 = uVar13 + 1;
                  if (uVar13 == uVar7) break;
                } while( true );
              }
              pUpsert->pUpsertIdx = pIVar10;
              break;
            }
LAB_001b31c2:
            pIVar10 = pIVar10->pNext;
          } while (pIVar10 != (Index *)0x0);
        }
        if (pUpsert->pUpsertIdx == (Index *)0x0) {
          if ((iVar9 == 0) && (pUpsert->pNextUpsert == (Upsert *)0x0)) {
            local_118[0] = '\0';
          }
          else {
            sqlite3_snprintf(0x10,local_118,"%r ",(ulong)(iVar9 + 1));
          }
          sqlite3ErrorMsg(pParse,
                          "%sON CONFLICT clause does not match any PRIMARY KEY or UNIQUE constraint"
                          ,local_118);
          return 1;
        }
      }
      pUpsert = pUpsert->pNextUpsert;
      iVar9 = iVar9 + 1;
    } while (pUpsert != (Upsert *)0x0);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3UpsertAnalyzeTarget(
  Parse *pParse,     /* The parsing context */
  SrcList *pTabList, /* Table into which we are inserting */
  Upsert *pUpsert    /* The ON CONFLICT clauses */
){
  Table *pTab;            /* That table into which we are inserting */
  int rc;                 /* Result code */
  int iCursor;            /* Cursor used by pTab */
  Index *pIdx;            /* One of the indexes of pTab */
  ExprList *pTarget;      /* The conflict-target clause */
  Expr *pTerm;            /* One term of the conflict-target clause */
  NameContext sNC;        /* Context for resolving symbolic names */
  Expr sCol[2];           /* Index column converted into an Expr */
  int nClause = 0;        /* Counter of ON CONFLICT clauses */

  assert( pTabList->nSrc==1 );
  assert( pTabList->a[0].pTab!=0 );
  assert( pUpsert!=0 );
  assert( pUpsert->pUpsertTarget!=0 );

  /* Resolve all symbolic names in the conflict-target clause, which
  ** includes both the list of columns and the optional partial-index
  ** WHERE clause.
  */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;
  for(; pUpsert && pUpsert->pUpsertTarget;
        pUpsert=pUpsert->pNextUpsert, nClause++){
    rc = sqlite3ResolveExprListNames(&sNC, pUpsert->pUpsertTarget);
    if( rc ) return rc;
    rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertTargetWhere);
    if( rc ) return rc;

    /* Check to see if the conflict target matches the rowid. */
    pTab = pTabList->a[0].pTab;
    pTarget = pUpsert->pUpsertTarget;
    iCursor = pTabList->a[0].iCursor;
    if( HasRowid(pTab)
     && pTarget->nExpr==1
     && (pTerm = pTarget->a[0].pExpr)->op==TK_COLUMN
     && pTerm->iColumn==XN_ROWID
    ){
      /* The conflict-target is the rowid of the primary table */
      assert( pUpsert->pUpsertIdx==0 );
      continue;
    }

    /* Initialize sCol[0..1] to be an expression parse tree for a
    ** single column of an index.  The sCol[0] node will be the TK_COLLATE
    ** operator and sCol[1] will be the TK_COLUMN operator.  Code below
    ** will populate the specific collation and column number values
    ** prior to comparing against the conflict-target expression.
    */
    memset(sCol, 0, sizeof(sCol));
    sCol[0].op = TK_COLLATE;
    sCol[0].pLeft = &sCol[1];
    sCol[1].op = TK_COLUMN;
    sCol[1].iTable = pTabList->a[0].iCursor;

    /* Check for matches against other indexes */
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int ii, jj, nn;
      if( !IsUniqueIndex(pIdx) ) continue;
      if( pTarget->nExpr!=pIdx->nKeyCol ) continue;
      if( pIdx->pPartIdxWhere ){
        if( pUpsert->pUpsertTargetWhere==0 ) continue;
        if( sqlite3ExprCompare(pParse, pUpsert->pUpsertTargetWhere,
                               pIdx->pPartIdxWhere, iCursor)!=0 ){
          continue;
        }
      }
      nn = pIdx->nKeyCol;
      for(ii=0; ii<nn; ii++){
        Expr *pExpr;
        sCol[0].u.zToken = (char*)pIdx->azColl[ii];
        if( pIdx->aiColumn[ii]==XN_EXPR ){
          assert( pIdx->aColExpr!=0 );
          assert( pIdx->aColExpr->nExpr>ii );
          assert( pIdx->bHasExpr );
          pExpr = pIdx->aColExpr->a[ii].pExpr;
          if( pExpr->op!=TK_COLLATE ){
            sCol[0].pLeft = pExpr;
            pExpr = &sCol[0];
          }
        }else{
          sCol[0].pLeft = &sCol[1];
          sCol[1].iColumn = pIdx->aiColumn[ii];
          pExpr = &sCol[0];
        }
        for(jj=0; jj<nn; jj++){
          if( sqlite3ExprCompare(pParse,pTarget->a[jj].pExpr,pExpr,iCursor)<2 ){
            break;  /* Column ii of the index matches column jj of target */
          }
        }
        if( jj>=nn ){
          /* The target contains no match for column jj of the index */
          break;
        }
      }
      if( ii<nn ){
        /* Column ii of the index did not match any term of the conflict target.
        ** Continue the search with the next index. */
        continue;
      }
      pUpsert->pUpsertIdx = pIdx;
      break;
    }
    if( pUpsert->pUpsertIdx==0 ){
      char zWhich[16];
      if( nClause==0 && pUpsert->pNextUpsert==0 ){
        zWhich[0] = 0;
      }else{
        sqlite3_snprintf(sizeof(zWhich),zWhich,"%r ", nClause+1);
      }
      sqlite3ErrorMsg(pParse, "%sON CONFLICT clause does not match any "
                              "PRIMARY KEY or UNIQUE constraint", zWhich);
      return SQLITE_ERROR;
    }
  }
  return SQLITE_OK;
}